

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O3

TableGrow * __thiscall
wasm::Builder::makeTableGrow(Builder *this,Name table,Expression *value,Expression *delta)

{
  TableGrow *this_00;
  Table *pTVar1;
  
  this_00 = (TableGrow *)MixedArena::allocSpace(&this->wasm->allocator,0x30,8);
  (this_00->super_SpecificExpression<(wasm::Expression::Id)48>).super_Expression._id = TableGrowId;
  (this_00->super_SpecificExpression<(wasm::Expression::Id)48>).super_Expression.type.id = 2;
  (this_00->table).super_IString.str._M_len = table.super_IString.str._M_len;
  (this_00->table).super_IString.str._M_str = table.super_IString.str._M_str;
  this_00->value = value;
  this_00->delta = delta;
  pTVar1 = Module::getTable(this->wasm,table);
  if ((pTVar1->addressType).id == 3) {
    (this_00->super_SpecificExpression<(wasm::Expression::Id)48>).super_Expression.type.id = 3;
  }
  TableGrow::finalize(this_00);
  return this_00;
}

Assistant:

TableGrow* makeTableGrow(Name table, Expression* value, Expression* delta) {
    auto* ret = wasm.allocator.alloc<TableGrow>();
    ret->table = table;
    ret->value = value;
    ret->delta = delta;
    if (isTable64(table)) {
      ret->type = Type::i64;
    }
    ret->finalize();
    return ret;
  }